

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  int iVar1;
  URLGlob *pUVar2;
  CURLcode CVar3;
  ulong uVar4;
  char *pcVar5;
  ulong local_98;
  unsigned_long i;
  URLPattern *pat;
  unsigned_long num;
  char *ptr;
  dynbuf dyn;
  size_t appendlen;
  char *appendthis;
  char numbuf [18];
  URLGlob *glob_local;
  char *filename_local;
  char **result_local;
  
  appendlen = (long)"WARNING: this libcurl is Debug-enabled, do not use in production\n\n" + 0x42;
  dyn.toobig = 0;
  *result = (char *)0x0;
  glob_local = (URLGlob *)filename;
  filename_local = (char *)result;
  curlx_dyn_init((dynbuf *)&ptr,0x2800);
  do {
    pUVar2 = glob_local;
    if ((char)glob_local->pattern[0].type == 0) {
      CVar3 = curlx_dyn_addn((dynbuf *)&ptr,"",0);
      if (CVar3 != CURLE_OK) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar5 = curlx_dyn_ptr((dynbuf *)&ptr);
      *(char **)filename_local = pcVar5;
      return CURLE_OK;
    }
    if ((((char)glob_local->pattern[0].type == 0x23) &&
        ('/' < (char)*(byte *)((long)&glob_local->pattern[0].type + 1))) &&
       ((char)*(byte *)((long)&glob_local->pattern[0].type + 1) < ':')) {
      uVar4 = strtoul((char *)((long)&glob_local->pattern[0].type + 1),(char **)&glob_local,10);
      i = 0;
      if ((uVar4 != 0) && (uVar4 < glob->size)) {
        for (local_98 = 0; local_98 < glob->size; local_98 = local_98 + 1) {
          if (glob->pattern[local_98].globindex == (int)uVar4 + -1) {
            i = (unsigned_long)(glob->pattern + local_98);
            break;
          }
        }
      }
      if (i == 0) {
        glob_local = (URLGlob *)((long)&pUVar2->pattern[0].type + 1);
        appendlen = (size_t)pUVar2;
        dyn.toobig = 1;
      }
      else {
        iVar1 = *(int *)i;
        if (iVar1 == 1) {
          if (*(long *)(i + 8) != 0) {
            appendlen = *(size_t *)(*(long *)(i + 8) + (long)*(int *)(i + 0x18) * 8);
            dyn.toobig = strlen(*(char **)(*(long *)(i + 8) + (long)*(int *)(i + 0x18) * 8));
          }
        }
        else if (iVar1 == 2) {
          appendthis._0_1_ = *(undefined1 *)(i + 10);
          appendthis._1_1_ = 0;
          appendlen = (size_t)&appendthis;
          dyn.toobig = 1;
        }
        else {
          if (iVar1 != 3) {
            curl_mfprintf(tool_stderr,"internal error: invalid pattern type (%d)\n",*(undefined4 *)i
                         );
            curlx_dyn_free((dynbuf *)&ptr);
            return CURLE_FAILED_INIT;
          }
          curl_msnprintf(&appendthis,0x12,"%0*ld",*(undefined4 *)(i + 0x18),
                         *(undefined8 *)(i + 0x20));
          appendlen = (size_t)&appendthis;
          dyn.toobig = strlen((char *)&appendthis);
        }
      }
    }
    else {
      appendlen = (size_t)glob_local;
      dyn.toobig = 1;
      glob_local = (URLGlob *)((long)&glob_local->pattern[0].type + 1);
    }
    CVar3 = curlx_dyn_addn((dynbuf *)&ptr,(void *)appendlen,dyn.toobig);
    if (CVar3 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, char *filename, struct URLGlob *glob)
{
  char numbuf[18];
  char *appendthis = (char *)"";
  size_t appendlen = 0;
  struct curlx_dynbuf dyn;

  *result = NULL;

  /* We cannot use the glob_buffer for storage since the filename may be
   * longer than the URL we use.
   */
  curlx_dyn_init(&dyn, MAX_OUTPUT_GLOB_LENGTH);

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      struct URLPattern *pat = NULL;

      if(num && (num < glob->size)) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i<glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          msnprintf(numbuf, sizeof(numbuf), "%0*" CURL_FORMAT_CURL_OFF_T,
                    pat->content.NumRange.padlength,
                    pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(tool_stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          curlx_dyn_free(&dyn);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(curlx_dyn_addn(&dyn, appendthis, appendlen))
      return CURLE_OUT_OF_MEMORY;
  }

  if(curlx_dyn_addn(&dyn, "", 0))
    return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, curlx_dyn_ptr(&dyn),
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    curlx_dyn_free(&dyn);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *result = sanitized;
    return CURLE_OK;
  }
#else
  *result = curlx_dyn_ptr(&dyn);
  return CURLE_OK;
#endif /* _WIN32 || MSDOS */
}